

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O3

void __thiscall SpecificStrategy::matchBlocks(SpecificStrategy *this,Block *aBlocks,Block *bBlocks)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  const_iterator __position;
  iterator __position_00;
  _Self __tmp;
  _Self __tmp_1;
  
  __position_00._M_node = (bBlocks->perfect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(bBlocks->perfect)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position_00._M_node != p_Var1) {
    p_Var2 = &(aBlocks->perfect)._M_t._M_impl.super__Rb_tree_header;
    do {
      __position._M_node = (aBlocks->perfect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)__position._M_node != p_Var2) {
        p_Var4 = __position_00._M_node[1]._M_parent;
        iVar3 = *(int *)&__position_00._M_node[1]._M_left;
        do {
          p_Var5 = __position._M_node[1]._M_parent;
          if ((p_Var5 == p_Var4) && (*(int *)&__position._M_node[1]._M_left == iVar3)) {
LAB_0010da5d:
            __position_00 =
                 std::
                 _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                 ::erase_abi_cxx11_((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                                     *)bBlocks,__position_00._M_node);
            goto LAB_0010da69;
          }
          if ((p_Var5 < (_Base_ptr)((long)&p_Var4->_M_color + (long)iVar3)) &&
             (p_Var4 < (_Base_ptr)
                       ((long)&p_Var5->_M_color + (long)*(int *)&__position._M_node[1]._M_left))) {
            std::
            _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
            ::_M_insert_unique<CfgData::Node_const&>
                      ((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                        *)&aBlocks->conflict,(Node *)(__position._M_node + 1));
            std::
            _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
            ::erase_abi_cxx11_((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                                *)aBlocks,__position);
            std::
            _Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
            ::_M_insert_unique<CfgData::Node_const&>
                      ((_Rb_tree<CfgData::Node,CfgData::Node,std::_Identity<CfgData::Node>,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                        *)&bBlocks->conflict,(Node *)(__position_00._M_node + 1));
            goto LAB_0010da5d;
          }
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        } while ((_Rb_tree_header *)__position._M_node != p_Var2);
      }
      __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
LAB_0010da69:
    } while ((_Rb_tree_header *)__position_00._M_node != p_Var1);
  }
  return;
}

Assistant:

void SpecificStrategy::matchBlocks(SpecificStrategy::Info::Block& aBlocks,
		SpecificStrategy::Info::Block& bBlocks) {
	for (std::set<CfgData::Node>::iterator bIT = bBlocks.perfect.begin(),
			bED = bBlocks.perfect.end(); bIT != bED; ) {
		bool next = true;
		for (std::set<CfgData::Node>::iterator aIT = aBlocks.perfect.begin(),
				aED = aBlocks.perfect.end(); aIT != aED; aIT++) {
			const CfgData::Node& aNode = *aIT;
			const CfgData::Node& bNode = *bIT;
			if (aNode == bNode) {
				bIT = bBlocks.perfect.erase(bIT);
				next = false;
				break;
			} else if (aNode.start < (bNode.start + bNode.size) &&
					   bNode.start < (aNode.start + aNode.size)) {
				aBlocks.conflict.insert(aNode);
				aBlocks.perfect.erase(aIT);

				bBlocks.conflict.insert(bNode);
				bIT = bBlocks.perfect.erase(bIT);

				next = false;
				break;
			}
		}

		if (next)
			bIT++;
	}
}